

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreCubeCollectTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  uint uVar1;
  uint **ppuVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  Gia_PtrAre_t GVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  
  do {
    uVar8 = *(uint *)pObj;
    uVar1 = *(uint *)(&pSta[1].iPrev.field_0x0 + (uVar8 >> 2 & 0xffc));
    uVar3 = uVar8 * 2 & 0x1e;
    if ((uVar1 >> uVar3 & 1) == 0) {
      if ((uVar1 >> (sbyte)uVar3 & 2) != 0) {
        GVar6 = pObj->F[1];
        if (((uint)GVar6 & 0x7fffffff) != 0 && (uVar8 & 0x3f00000) == 0) goto LAB_0069d9e4;
        ppuVar2 = p->ppStas;
        iVar4 = p->nSize;
        puVar5 = *ppuVar2;
        puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                         *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
        while (puVar5 != puVar9) {
          if (-1 < (int)*puVar9) {
            if (0 < (long)p->nWords) {
              lVar7 = 0;
              do {
                uVar8 = puVar9[lVar7 + 2] ^ (uint)(&pSta[1].iPrev)[lVar7];
                if ((uVar8 >> 1 & uVar8 & 0x55555555) != 0) goto LAB_0069d9b6;
                lVar7 = lVar7 + 1;
              } while (p->nWords != lVar7);
            }
            Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar6 & 0x7fffffff)],
                        (uint)GVar6 & 0x7fffffff);
            ppuVar2 = p->ppStas;
            iVar4 = p->nSize;
            puVar5 = *ppuVar2;
          }
LAB_0069d9b6:
          GVar6 = *(Gia_PtrAre_t *)(puVar9 + 1);
          puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                           *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
        }
      }
    }
    else {
      GVar6 = pObj->F[0];
      if (((uint)GVar6 & 0x7fffffff) == 0 || (uVar8 & 0xfc000) != 0) {
        ppuVar2 = p->ppStas;
        iVar4 = p->nSize;
        puVar5 = *ppuVar2;
        puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                         *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
        while (puVar5 != puVar9) {
          if (-1 < (int)*puVar9) {
            if (0 < (long)p->nWords) {
              lVar7 = 0;
              do {
                uVar8 = puVar9[lVar7 + 2] ^ (uint)(&pSta[1].iPrev)[lVar7];
                if ((uVar8 >> 1 & uVar8 & 0x55555555) != 0) goto LAB_0069d8cd;
                lVar7 = lVar7 + 1;
              } while (p->nWords != lVar7);
            }
            Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar6 & 0x7fffffff)],
                        (uint)GVar6 & 0x7fffffff);
            ppuVar2 = p->ppStas;
            iVar4 = p->nSize;
            puVar5 = *ppuVar2;
          }
LAB_0069d8cd:
          GVar6 = *(Gia_PtrAre_t *)(puVar9 + 1);
          puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                           *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
        }
      }
      else {
LAB_0069d9e4:
        Gia_ManAreCubeCollectTree_rec
                  (p,(Gia_ObjAre_t *)
                     ((ulong)(((uint)GVar6 & 0xfffff) << 4) +
                     *(long *)((long)p->ppObjs + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8))),pSta);
      }
    }
    GVar6 = pObj->F[2];
    if ((0x3ffffff < *(uint *)pObj) || (((uint)GVar6 & 0x7fffffff) == 0)) {
      ppuVar2 = p->ppStas;
      iVar4 = p->nSize;
      puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                       *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
      puVar5 = *ppuVar2;
      do {
        if (puVar5 == puVar9) {
          return 1;
        }
        if (-1 < (int)*puVar9) {
          if (0 < (long)p->nWords) {
            lVar7 = 0;
            do {
              uVar8 = puVar9[lVar7 + 2] ^ (uint)(&pSta[1].iPrev)[lVar7];
              if ((uVar8 >> 1 & uVar8 & 0x55555555) != 0) goto LAB_0069dad4;
              lVar7 = lVar7 + 1;
            } while (p->nWords != lVar7);
          }
          Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar6 & 0x7fffffff)],
                      (uint)GVar6 & 0x7fffffff);
          ppuVar2 = p->ppStas;
          iVar4 = p->nSize;
          puVar5 = *ppuVar2;
        }
LAB_0069dad4:
        GVar6 = *(Gia_PtrAre_t *)(puVar9 + 1);
        puVar9 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                         *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
      } while( true );
    }
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)GVar6 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

int Gia_ManAreCubeCollectTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    int RetValue;
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            RetValue = Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCollectList( p, pObj->F, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            RetValue = Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCollectList( p, pObj->F + 1, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    if ( Gia_ObjHasBranch2(pObj) )
        return Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
    return Gia_ManAreCubeCollectList( p, pObj->F + 2, pSta );
}